

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODITFReader.cpp
# Opt level: O2

Barcode * __thiscall
ZXing::OneD::ITFReader::decodePattern
          (Barcode *__return_storage_ptr__,ITFReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_3)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  Iterator puVar4;
  bool bVar5;
  int xStart;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int i_1;
  long lVar10;
  anon_class_16_2_7a905435 isGuard;
  BarAndSpace<int> numWide;
  BarAndSpaceI threshold;
  string txt;
  BarAndSpace<int> digits;
  size_type sStack_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  char *local_90;
  undefined8 uStack_88;
  Error local_80;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [13];
  undefined2 local_33;
  char local_31;
  
  isGuard.minQuietZone = 10.0;
  isGuard.pattern = (FixedPattern<4,_4,_false> *)param_3;
  FindLeftGuard<4,ZXing::FindLeftGuard<4,4,false>(ZXing::PatternView_const&,int,ZXing::FixedPattern<4,4,false>const&,double)::_lambda(ZXing::PatternView_const&,int)_1_>
            ((PatternView *)&digits,(ZXing *)next,(PatternView *)&DAT_0000000a,0x1a0160,isGuard);
  *(undefined4 *)&next->_base = local_a0._M_allocated_capacity._0_4_;
  *(undefined4 *)((long)&next->_base + 4) = local_a0._M_allocated_capacity._4_4_;
  *(undefined4 *)&next->_end = local_a0._8_4_;
  *(uint *)((long)&next->_end + 4) =
       CONCAT13(local_a0._M_local_buf[0xf],CONCAT21(local_a0._13_2_,local_a0._M_local_buf[0xc]));
  next->_data = (Iterator)digits;
  *(size_type *)&next->_size = sStack_a8;
  bVar5 = PatternView::isValid(next);
  if (!bVar5) {
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  txt._M_dataplus._M_p = (pointer)&txt.field_2;
  txt._M_string_length = 0;
  txt.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&txt);
  xStart = PatternView::pixelsInFront(next);
  next->_data = next->_data + 4;
  next->_size = 10;
  while (bVar5 = PatternView::isValid(next), bVar5) {
    threshold = RowReader::NarrowWideThreshold(next);
    if ((threshold.bar == 0) || ((uint)threshold < 0x10000)) break;
    digits.bar = 0;
    digits.space = 0;
    numWide.bar = 0;
    numWide.space = 0;
    puVar4 = next->_data;
    for (uVar7 = 0; uVar7 != 10; uVar7 = uVar7 + 1) {
      uVar2 = puVar4[uVar7];
      uVar8 = (uint)uVar7 & 1;
      uVar3 = (&threshold.bar)[uVar8];
      if ((uint)uVar3 + (uint)uVar3 < (uint)uVar2) break;
      iVar6 = 0;
      if (uVar3 < uVar2) {
        iVar6 = *(int *)(&DAT_001a0190 + (uVar7 >> 1 & 0x7fffffff) * 4);
      }
      uVar9 = (ulong)(uVar8 << 2);
      piVar1 = (int *)((long)&numWide.bar + uVar9);
      *piVar1 = *piVar1 + (uint)(uVar3 < uVar2);
      piVar1 = (int *)((long)&digits.bar + uVar9);
      *piVar1 = *piVar1 + iVar6;
    }
    if ((numWide.bar != 2) || (numWide.space != 2)) break;
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      iVar6 = (&digits.bar)[lVar10];
      if (iVar6 == 0xb) {
        iVar6 = 0;
      }
      ToDigit<char>(iVar6);
      std::__cxx11::string::push_back((char)&txt);
    }
    if (next->_data != (Iterator)0x0) {
      next->_data = next->_data + next->_size;
    }
  }
  next->_size = 3;
  if ((((int)txt._M_string_length < 6) || (bVar5 = PatternView::isValid(next), !bVar5)) ||
     ((bVar5 = IsRightGuard<3,4,false>(next,(FixedPattern<3,_4,_false> *)&STOP_PATTERN_1,10.0,0.0),
      !bVar5 && (bVar5 = IsRightGuard<3,5,false>
                                   (next,(FixedPattern<3,_5,_false> *)&STOP_PATTERN_2,10.0,0.0),
                !bVar5)))) {
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
  }
  else {
    if (((undefined1  [12])
         ((undefined1  [12])*(this->super_RowReader)._opts & (undefined1  [12])0x80) ==
         (undefined1  [12])0x0) || (bVar5 = GTIN::IsCheckDigitValid<char>(&txt), bVar5)) {
      digits = (BarAndSpace<int>)&local_a0;
      local_a0._M_allocated_capacity._0_4_ = 0;
      local_a0._M_allocated_capacity._4_4_ = 0;
      local_a0._8_4_ = 0;
      local_a0._M_local_buf[0xc] = '\0';
      local_a0._13_2_ = 0;
      local_a0._M_local_buf[0xf] = '\0';
      local_90 = (char *)0x0;
      uStack_88._0_2_ = -1;
      uStack_88._2_1_ = None;
      uStack_88._3_5_ = 0;
    }
    else {
      local_50 = local_40;
      digits = (BarAndSpace<int>)&local_a0;
      local_a0._M_allocated_capacity._1_3_ = (undefined3)local_40._1_8_;
      local_a0._M_allocated_capacity._0_4_ = (uint)(uint3)local_a0._M_allocated_capacity._1_3_ << 8;
      local_a0._M_allocated_capacity._4_4_ = SUB84(local_40._1_8_,3);
      local_a0._M_local_buf[8] = SUB81(local_40._1_8_,7);
      local_a0._9_3_ = (undefined3)local_40._9_4_;
      local_a0._M_local_buf[0xc] = SUB41(local_40._9_4_,3);
      local_a0._13_2_ = local_33;
      local_a0._M_local_buf[0xf] = local_31;
      local_48 = 0;
      local_40[0] = 0;
      local_90 = "src/oned/ODITFReader.cpp";
      uStack_88._0_3_ = 0x20042;
      std::__cxx11::string::~string((string *)&local_50);
    }
    bVar5 = GTIN::IsCheckDigitValid<char>(&txt);
    iVar6 = PatternView::pixelsTillEnd(next);
    Error::Error(&local_80,(Error *)&digits);
    Result::Result(__return_storage_ptr__,&txt,rowNumber,xStart,iVar6,ITF,
                   (SymbologyIdentifier)((uint)bVar5 << 8 | 0x3049),&local_80,false);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&digits);
  }
  std::__cxx11::string::~string((string *)&txt);
  return __return_storage_ptr__;
}

Assistant:

Barcode ITFReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>&) const
{
	const int minCharCount = 6;
	const int minQuietZone = 10;

	next = FindLeftGuard(next, 4 + minCharCount/2 + 3, START_PATTERN_, minQuietZone);
	if (!next.isValid())
		return {};

	std::string txt;
	txt.reserve(20);

	constexpr int weights[] = {1, 2, 4, 7, 0};
	int xStart = next.pixelsInFront();
	next = next.subView(4, 10);

	while (next.isValid()) {
		const auto threshold = NarrowWideThreshold(next);
		if (!threshold.isValid())
			break;

		BarAndSpace<int> digits, numWide;
		for (int i = 0; i < 10; ++i) {
			if (next[i] > threshold[i] * 2)
				break;
			numWide[i] += next[i] > threshold[i];
			digits[i] += weights[i/2] * (next[i] > threshold[i]);
		}

		if (numWide.bar != 2 || numWide.space != 2)
			break;

		for (int i = 0; i < 2; ++i)
			txt.push_back(ToDigit(digits[i] == 11 ? 0 : digits[i]));

		next.skipSymbol();
	}

	next = next.subView(0, 3);

	if (Size(txt) < minCharCount || !next.isValid())
		return {};

	if (!IsRightGuard(next, STOP_PATTERN_1, minQuietZone) && !IsRightGuard(next, STOP_PATTERN_2, minQuietZone))
		return {};

	Error error = _opts.validateITFCheckSum() && !GTIN::IsCheckDigitValid(txt) ? ChecksumError() : Error();

	// Symbology identifier ISO/IEC 16390:2007 Annex C Table C.1
	// See also GS1 General Specifications 5.1.2 Figure 5.1.2-2
	SymbologyIdentifier symbologyIdentifier = {'I', GTIN::IsCheckDigitValid(txt) ? '1' : '0'};
	
	int xStop = next.pixelsTillEnd();
	return Barcode(txt, rowNumber, xStart, xStop, BarcodeFormat::ITF, symbologyIdentifier, error);
}